

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_renderer.cpp
# Opt level: O3

void __thiscall
duckdb::BoxRenderer::Render
          (BoxRenderer *this,ClientContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,ColumnDataCollection *result,BaseResultRenderer *ss)

{
  value_type vVar1;
  unsigned_long uVar2;
  bool bVar3;
  pointer puVar4;
  LogicalType *this_00;
  char cVar5;
  int iVar6;
  ulong uVar7;
  long *plVar8;
  reference pvVar9;
  undefined8 *puVar10;
  InternalException *this_01;
  size_type *psVar11;
  ulong uVar12;
  ulong uVar13;
  long *plVar14;
  pointer puVar15;
  size_type __n;
  ulong uVar16;
  idx_t iVar17;
  size_type sVar18;
  char cVar19;
  idx_t min_width;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  ulong uVar21;
  bool bVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> column_count_str;
  string __str_1;
  string shown_str;
  bool local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> row_count_str;
  long *local_188;
  long local_180;
  long local_178;
  long lStack_170;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_168;
  ulong local_160;
  list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_> collections;
  vector<duckdb::LogicalType,_true> result_types;
  vector<unsigned_long,_true> boundaries;
  vector<unsigned_long,_true> widths;
  char *local_f0;
  uint local_e8;
  char local_e0 [16];
  _List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_> local_d0;
  vector<unsigned_long,_true> column_map;
  idx_t total_length;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  column_names;
  string local_70;
  string local_50;
  
  if (((long)(result->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(result->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
      ((long)(names->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(names->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5) != 0) {
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    row_count_str._M_dataplus._M_p = (pointer)&row_count_str.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&row_count_str,"Error in BoxRenderer::Render - unaligned columns and names"
               ,"");
    InternalException::InternalException(this_01,&row_count_str);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar7 = (this->config).max_width;
  if (uVar7 == 0) {
    iVar6 = isatty(1);
    if (iVar6 == 0) {
      uVar7 = 0x78;
    }
    else {
      ioctl(0,0x5413,&row_count_str);
      uVar7 = (ulong)row_count_str._M_dataplus._M_p._2_2_;
    }
  }
  iVar17 = 0x50;
  if (0x50 < uVar7) {
    iVar17 = uVar7;
  }
  uVar7 = result->count;
  uVar16 = (this->config).max_rows;
  uVar13 = uVar16;
  if (uVar7 < uVar16) {
    uVar13 = uVar7;
  }
  if (uVar7 <= uVar16 + 3) {
    uVar13 = uVar7;
  }
  local_160 = 0;
  uVar16 = uVar7;
  if (uVar13 != uVar7) {
    local_160 = uVar13 >> 1;
    uVar16 = uVar13 - (uVar13 >> 1);
  }
  cVar19 = '\x01';
  if (9 < uVar7) {
    uVar21 = uVar7;
    cVar5 = '\x04';
    do {
      cVar19 = cVar5;
      if (uVar21 < 100) {
        cVar19 = cVar19 + -2;
        goto LAB_00e47808;
      }
      if (uVar21 < 1000) {
        cVar19 = cVar19 + -1;
        goto LAB_00e47808;
      }
      if (uVar21 < 10000) goto LAB_00e47808;
      bVar22 = 99999 < uVar21;
      uVar21 = uVar21 / 10000;
      cVar5 = cVar19 + '\x04';
    } while (bVar22);
    cVar19 = cVar19 + '\x01';
  }
LAB_00e47808:
  paVar20 = &shown_str.field_2;
  shown_str._M_dataplus._M_p = (pointer)paVar20;
  local_168 = &names->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  ::std::__cxx11::string::_M_construct((ulong)&shown_str,cVar19);
  ::std::__detail::__to_chars_10_impl<unsigned_long>
            (shown_str._M_dataplus._M_p,(uint)shown_str._M_string_length,uVar7);
  plVar8 = (long *)::std::__cxx11::string::append((char *)&shown_str);
  row_count_str._M_dataplus._M_p = (pointer)&row_count_str.field_2;
  psVar11 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar11) {
    row_count_str.field_2._M_allocated_capacity = *psVar11;
    row_count_str.field_2._8_8_ = plVar8[3];
  }
  else {
    row_count_str.field_2._M_allocated_capacity = *psVar11;
    row_count_str._M_dataplus._M_p = (pointer)*plVar8;
  }
  row_count_str._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shown_str._M_dataplus._M_p != paVar20) {
    operator_delete(shown_str._M_dataplus._M_p);
  }
  uVar21 = (this->config).limit;
  if (uVar7 == uVar21 && uVar21 != 0) {
    ::std::__cxx11::string::_M_replace
              ((ulong)&row_count_str,0,(char *)row_count_str._M_string_length,0x1db9c91);
  }
  shown_str._M_string_length = 0;
  shown_str.field_2._M_local_buf[0] = '\0';
  local_1c0 = uVar16 < uVar7;
  shown_str._M_dataplus._M_p = (pointer)paVar20;
  if (local_1c0) {
    ::std::__cxx11::string::_M_replace((ulong)&shown_str,0,(char *)0x0,0x1e0f04c);
    if (uVar7 == uVar21 && uVar21 != 0) {
      uVar21 = (this->config).limit - 1;
      cVar19 = '\x01';
      if (9 < uVar21) {
        uVar12 = uVar21;
        cVar5 = '\x04';
        do {
          cVar19 = cVar5;
          if (uVar12 < 100) {
            cVar19 = cVar19 + -2;
            goto LAB_00e47988;
          }
          if (uVar12 < 1000) {
            cVar19 = cVar19 + -1;
            goto LAB_00e47988;
          }
          if (uVar12 < 10000) goto LAB_00e47988;
          bVar22 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          cVar5 = cVar19 + '\x04';
        } while (bVar22);
        cVar19 = cVar19 + '\x01';
      }
LAB_00e47988:
      local_188 = &local_178;
      ::std::__cxx11::string::_M_construct((ulong)&local_188,cVar19);
      ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_188,(uint)local_180,uVar21);
      plVar8 = (long *)::std::__cxx11::string::replace((ulong)&local_188,0,(char *)0x0,0x1e02d9e);
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar11) {
        __str_1.field_2._M_allocated_capacity = *psVar11;
        __str_1.field_2._8_8_ = plVar8[3];
        __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
      }
      else {
        __str_1.field_2._M_allocated_capacity = *psVar11;
        __str_1._M_dataplus._M_p = (pointer)*plVar8;
      }
      __str_1._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)::std::__cxx11::string::append((char *)&__str_1);
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar11) {
        column_count_str.field_2._M_allocated_capacity = *psVar11;
        column_count_str.field_2._8_8_ = plVar8[3];
        column_count_str._M_dataplus._M_p = (pointer)&column_count_str.field_2;
      }
      else {
        column_count_str.field_2._M_allocated_capacity = *psVar11;
        column_count_str._M_dataplus._M_p = (pointer)*plVar8;
      }
      column_count_str._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&shown_str,(ulong)column_count_str._M_dataplus._M_p)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)column_count_str._M_dataplus._M_p != &column_count_str.field_2) {
        operator_delete(column_count_str._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
        operator_delete(__str_1._M_dataplus._M_p);
      }
      if (local_188 != &local_178) {
        operator_delete(local_188);
      }
    }
    cVar19 = '\x01';
    if (9 < uVar13) {
      uVar21 = uVar13;
      cVar5 = '\x04';
      do {
        cVar19 = cVar5;
        if (uVar21 < 100) {
          cVar19 = cVar19 + -2;
          goto LAB_00e47b19;
        }
        if (uVar21 < 1000) {
          cVar19 = cVar19 + -1;
          goto LAB_00e47b19;
        }
        if (uVar21 < 10000) goto LAB_00e47b19;
        bVar22 = 99999 < uVar21;
        uVar21 = uVar21 / 10000;
        cVar5 = cVar19 + '\x04';
      } while (bVar22);
      cVar19 = cVar19 + '\x01';
    }
LAB_00e47b19:
    __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&__str_1,cVar19);
    ::std::__detail::__to_chars_10_impl<unsigned_long>
              (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar13);
    plVar8 = (long *)::std::__cxx11::string::append((char *)&__str_1);
    psVar11 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar11) {
      column_count_str.field_2._M_allocated_capacity = *psVar11;
      column_count_str.field_2._8_8_ = plVar8[3];
      column_count_str._M_dataplus._M_p = (pointer)&column_count_str.field_2;
    }
    else {
      column_count_str.field_2._M_allocated_capacity = *psVar11;
      column_count_str._M_dataplus._M_p = (pointer)*plVar8;
    }
    column_count_str._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&shown_str,(ulong)column_count_str._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)column_count_str._M_dataplus._M_p != &column_count_str.field_2) {
      operator_delete(column_count_str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
      operator_delete(__str_1._M_dataplus._M_p);
    }
  }
  sVar18 = shown_str._M_string_length;
  if (shown_str._M_string_length < row_count_str._M_string_length) {
    sVar18 = row_count_str._M_string_length;
  }
  FetchRenderCollections_abi_cxx11_(&collections,this,context,result,uVar16,local_160);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&column_names,local_168);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&result_types,
             &(result->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  if ((this->config).render_mode == COLUMNS) {
    local_d0._M_impl._M_node.super__List_node_base._M_next =
         collections.
         super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    local_d0._M_impl._M_node.super__List_node_base._M_prev =
         collections.
         super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
         ._M_impl._M_node.super__List_node_base._M_prev;
    local_d0._M_impl._M_node._M_size =
         collections.
         super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
         ._M_impl._M_node._M_size;
    if (collections.
        super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
        ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&collections) {
      local_d0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_d0;
      local_d0._M_impl._M_node.super__List_node_base._M_prev =
           local_d0._M_impl._M_node.super__List_node_base._M_next;
    }
    else {
      (collections.
       super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
       ._M_impl._M_node.super__List_node_base._M_prev)->_M_next = (_List_node_base *)&local_d0;
      (collections.
       super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
       ._M_impl._M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)&local_d0;
      collections.
      super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>.
      _M_impl._M_node._M_size = 0;
      collections.
      super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>.
      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&collections;
      collections.
      super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>.
      _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&collections;
    }
    PivotCollections((list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
                      *)&column_count_str,this,context,
                     (list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
                      *)&local_d0,&column_names,&result_types,uVar7);
    std::__cxx11::list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
    ::_M_move_assign(&collections,&column_count_str);
    std::__cxx11::
    _List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>::
    _M_clear((_List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
              *)&column_count_str);
    std::__cxx11::
    _List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>::
    _M_clear(&local_d0);
  }
  local_160 = sVar18 + 4;
  min_width = local_160;
  if (uVar7 - 1 < uVar16) {
    min_width = 0;
  }
  column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ComputeRenderWidths(&widths,this,&column_names,&result_types,&collections,min_width,iVar17,
                      &column_map,&total_length);
  boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (widths.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      widths.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      if (__n == 0) {
        pvVar9 = vector<unsigned_long,_true>::operator[](&widths,0);
        column_count_str._M_dataplus._M_p = (pointer)(*pvVar9 + 2);
      }
      else {
        pvVar9 = vector<unsigned_long,_true>::operator[](&boundaries,__n - 1);
        vVar1 = *pvVar9;
        pvVar9 = vector<unsigned_long,_true>::operator[](&widths,__n);
        column_count_str._M_dataplus._M_p = (pointer)(*pvVar9 + vVar1 + 3);
      }
      if (boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&boundaries,
                   (iterator)
                   boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(unsigned_long *)&column_count_str);
      }
      else {
        *boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = (unsigned_long)column_count_str._M_dataplus._M_p;
        boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)widths.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)widths.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  RenderHeader(this,&column_names,&result_types,&column_map,&widths,&boundaries,total_length,
               uVar7 != 0,ss);
  RenderValues(this,&collections,&column_map,&widths,&result_types,ss);
  uVar16 = ((long)(result->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(result->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  cVar19 = '\x01';
  if (9 < uVar16) {
    uVar13 = uVar16;
    cVar5 = '\x04';
    do {
      cVar19 = cVar5;
      if (uVar13 < 100) {
        cVar19 = cVar19 + -2;
        goto LAB_00e47f61;
      }
      if (uVar13 < 1000) {
        cVar19 = cVar19 + -1;
        goto LAB_00e47f61;
      }
      if (uVar13 < 10000) goto LAB_00e47f61;
      bVar22 = 99999 < uVar13;
      uVar13 = uVar13 / 10000;
      cVar5 = cVar19 + '\x04';
    } while (bVar22);
    cVar19 = cVar19 + '\x01';
  }
LAB_00e47f61:
  local_168 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)total_length;
  paVar20 = &__str_1.field_2;
  __str_1._M_dataplus._M_p = (pointer)paVar20;
  ::std::__cxx11::string::_M_construct((ulong)&__str_1,cVar19);
  ::std::__detail::__to_chars_10_impl<unsigned_long>
            (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar16);
  plVar8 = (long *)::std::__cxx11::string::append((char *)&__str_1);
  column_count_str._M_dataplus._M_p = (pointer)&column_count_str.field_2;
  psVar11 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar11) {
    column_count_str.field_2._M_allocated_capacity = *psVar11;
    column_count_str.field_2._8_8_ = plVar8[3];
  }
  else {
    column_count_str.field_2._M_allocated_capacity = *psVar11;
    column_count_str._M_dataplus._M_p = (pointer)*plVar8;
  }
  column_count_str._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_1._M_dataplus._M_p != paVar20) {
    operator_delete(__str_1._M_dataplus._M_p);
  }
  if (1 < (ulong)(((long)(result->types).
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(result->types).
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
    ::std::__cxx11::string::append((char *)&column_count_str);
  }
  puVar4 = column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar17 = (long)column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    if ((this->config).render_mode == COLUMNS) goto LAB_00e480f2;
  }
  else {
    do {
      puVar15 = puVar4 + 1;
      uVar2 = *puVar4;
      bVar22 = uVar2 == 0xffffffffffffffff;
      if (bVar22) break;
      puVar4 = puVar15;
    } while (puVar15 !=
             column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish);
    iVar17 = (long)column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    if ((this->config).render_mode == COLUMNS) {
      if (uVar2 == 0xffffffffffffffff) {
        uVar16 = iVar17 - 3;
        cVar19 = '\x01';
        if (9 < uVar16) {
          uVar13 = uVar16;
          cVar5 = '\x04';
          do {
            cVar19 = cVar5;
            if (uVar13 < 100) {
              cVar19 = cVar19 + -2;
              goto LAB_00e483b0;
            }
            if (uVar13 < 1000) {
              cVar19 = cVar19 + -1;
              goto LAB_00e483b0;
            }
            if (uVar13 < 10000) goto LAB_00e483b0;
            bVar3 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar5 = cVar19 + '\x04';
          } while (bVar3);
          cVar19 = cVar19 + '\x01';
        }
LAB_00e483b0:
        local_f0 = local_e0;
        ::std::__cxx11::string::_M_construct((ulong)&local_f0,cVar19);
        ::std::__detail::__to_chars_10_impl<unsigned_long>(local_f0,local_e8,uVar16);
        plVar8 = (long *)::std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x1e0f04b);
        plVar14 = plVar8 + 2;
        if ((long *)*plVar8 == plVar14) {
          local_178 = *plVar14;
          lStack_170 = plVar8[3];
          local_188 = &local_178;
        }
        else {
          local_178 = *plVar14;
          local_188 = (long *)*plVar8;
        }
        local_180 = plVar8[1];
        *plVar8 = (long)plVar14;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)::std::__cxx11::string::append((char *)&local_188);
        psVar11 = (size_type *)(plVar8 + 2);
        if ((size_type *)*plVar8 == psVar11) {
          __str_1.field_2._M_allocated_capacity = *psVar11;
          __str_1.field_2._8_8_ = plVar8[3];
          __str_1._M_dataplus._M_p = (pointer)paVar20;
        }
        else {
          __str_1.field_2._M_allocated_capacity = *psVar11;
          __str_1._M_dataplus._M_p = (pointer)*plVar8;
        }
        __str_1._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)&shown_str,(string *)&__str_1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != paVar20) {
          operator_delete(__str_1._M_dataplus._M_p);
        }
        if (local_188 != &local_178) {
          operator_delete(local_188);
        }
        if (local_f0 != local_e0) {
          operator_delete(local_f0);
        }
        local_1c0 = true;
        goto LAB_00e48134;
      }
LAB_00e480f2:
      __str_1._M_string_length = 0;
      __str_1.field_2._M_allocated_capacity =
           __str_1.field_2._M_allocated_capacity & 0xffffffffffffff00;
      __str_1._M_dataplus._M_p = (pointer)paVar20;
      ::std::__cxx11::string::operator=((string *)&shown_str,(string *)&__str_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar20) {
        operator_delete(__str_1._M_dataplus._M_p);
      }
    }
    else if (uVar2 == 0xffffffffffffffff) {
      iVar17 = iVar17 - 1;
      cVar19 = '\x01';
      if (9 < iVar17) {
        uVar16 = iVar17;
        cVar5 = '\x04';
        do {
          cVar19 = cVar5;
          if (uVar16 < 100) {
            cVar19 = cVar19 + -2;
            goto LAB_00e48509;
          }
          if (uVar16 < 1000) {
            cVar19 = cVar19 + -1;
            goto LAB_00e48509;
          }
          if (uVar16 < 10000) goto LAB_00e48509;
          bVar3 = 99999 < uVar16;
          uVar16 = uVar16 / 10000;
          cVar5 = cVar19 + '\x04';
        } while (bVar3);
        cVar19 = cVar19 + '\x01';
      }
LAB_00e48509:
      local_f0 = local_e0;
      ::std::__cxx11::string::_M_construct((ulong)&local_f0,cVar19);
      ::std::__detail::__to_chars_10_impl<unsigned_long>(local_f0,local_e8,iVar17);
      puVar10 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x1e0f04b);
      plVar8 = puVar10 + 2;
      if ((long *)*puVar10 == plVar8) {
        local_178 = *plVar8;
        lStack_170 = puVar10[3];
        local_188 = &local_178;
      }
      else {
        local_178 = *plVar8;
        local_188 = (long *)*puVar10;
      }
      local_180 = puVar10[1];
      *puVar10 = plVar8;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      plVar8 = (long *)::std::__cxx11::string::append((char *)&local_188);
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar11) {
        __str_1.field_2._M_allocated_capacity = *psVar11;
        __str_1.field_2._8_8_ = plVar8[3];
        __str_1._M_dataplus._M_p = (pointer)paVar20;
      }
      else {
        __str_1.field_2._M_allocated_capacity = *psVar11;
        __str_1._M_dataplus._M_p = (pointer)*plVar8;
      }
      __str_1._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&column_count_str,(ulong)__str_1._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar20) {
        operator_delete(__str_1._M_dataplus._M_p);
      }
      if (local_188 != &local_178) {
        operator_delete(local_188);
      }
      if (local_f0 != local_e0) {
        operator_delete(local_f0);
      }
      goto LAB_00e48134;
    }
  }
  bVar22 = false;
LAB_00e48134:
  paVar20 = &shown_str.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)row_count_str._M_dataplus._M_p == &row_count_str.field_2) {
    local_70.field_2._8_8_ = row_count_str.field_2._8_8_;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70._M_dataplus._M_p = row_count_str._M_dataplus._M_p;
  }
  local_70.field_2._M_allocated_capacity = row_count_str.field_2._M_allocated_capacity;
  local_70._M_string_length = row_count_str._M_string_length;
  row_count_str._M_string_length = 0;
  row_count_str.field_2._M_allocated_capacity =
       row_count_str.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shown_str._M_dataplus._M_p == paVar20) {
    local_50.field_2._8_8_ = shown_str.field_2._8_8_;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50._M_dataplus._M_p = shown_str._M_dataplus._M_p;
  }
  local_50.field_2._M_allocated_capacity._1_7_ = shown_str.field_2._M_allocated_capacity._1_7_;
  local_50.field_2._M_local_buf[0] = shown_str.field_2._M_local_buf[0];
  local_50._M_string_length = shown_str._M_string_length;
  shown_str._M_string_length = 0;
  shown_str.field_2._M_local_buf[0] = '\0';
  shown_str._M_dataplus._M_p = (pointer)paVar20;
  row_count_str._M_dataplus._M_p = (pointer)&row_count_str.field_2;
  RenderRowCount(this,&local_70,&local_50,&column_count_str,&boundaries,local_1c0,bVar22,
                 (idx_t)local_168,uVar7,iVar17,local_160,ss);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)column_count_str._M_dataplus._M_p != &column_count_str.field_2) {
    operator_delete(column_count_str._M_dataplus._M_p);
  }
  if (boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (widths.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(widths.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  this_00 = result_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
    this_00 = result_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  for (; this_00 !=
         result_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    LogicalType::~LogicalType(this_00);
  }
  if (result_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(result_types.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&column_names);
  std::__cxx11::
  _List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>::_M_clear
            (&collections.
              super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shown_str._M_dataplus._M_p != paVar20) {
    operator_delete(shown_str._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)row_count_str._M_dataplus._M_p != &row_count_str.field_2) {
    operator_delete(row_count_str._M_dataplus._M_p);
  }
  return;
}

Assistant:

void BoxRenderer::Render(ClientContext &context, const vector<string> &names, const ColumnDataCollection &result,
                         BaseResultRenderer &ss) {
	if (result.ColumnCount() != names.size()) {
		throw InternalException("Error in BoxRenderer::Render - unaligned columns and names");
	}
	auto max_width = config.max_width;
	if (max_width == 0) {
		if (Printer::IsTerminal(OutputStream::STREAM_STDOUT)) {
			max_width = Printer::TerminalWidth();
		} else {
			max_width = 120;
		}
	}
	// we do not support max widths under 80
	max_width = MaxValue<idx_t>(80, max_width);

	// figure out how many/which rows to render
	idx_t row_count = result.Count();
	idx_t rows_to_render = MinValue<idx_t>(row_count, config.max_rows);
	if (row_count <= config.max_rows + 3) {
		// hiding rows adds 3 extra rows
		// so hiding rows makes no sense if we are only slightly over the limit
		// if we are 1 row over the limit hiding rows will actually increase the number of lines we display!
		// in this case render all the rows
		rows_to_render = row_count;
	}
	idx_t top_rows;
	idx_t bottom_rows;
	if (rows_to_render == row_count) {
		top_rows = row_count;
		bottom_rows = 0;
	} else {
		top_rows = rows_to_render / 2 + (rows_to_render % 2 != 0 ? 1 : 0);
		bottom_rows = rows_to_render - top_rows;
	}
	auto row_count_str = to_string(row_count) + " rows";
	bool has_limited_rows = config.limit > 0 && row_count == config.limit;
	if (has_limited_rows) {
		row_count_str = "? rows";
	}
	string shown_str;
	bool has_hidden_rows = top_rows < row_count;
	if (has_hidden_rows) {
		shown_str = "(";
		if (has_limited_rows) {
			shown_str += ">" + to_string(config.limit - 1) + " rows, ";
		}
		shown_str += to_string(top_rows + bottom_rows) + " shown)";
	}
	auto minimum_row_length = MaxValue<idx_t>(row_count_str.size(), shown_str.size()) + 4;

	// fetch the top and bottom render collections from the result
	auto collections = FetchRenderCollections(context, result, top_rows, bottom_rows);
	auto column_names = names;
	auto result_types = result.Types();
	if (config.render_mode == RenderMode::COLUMNS) {
		collections = PivotCollections(context, std::move(collections), column_names, result_types, row_count);
	}

	// for each column, figure out the width
	// start off by figuring out the name of the header by looking at the column name and column type
	idx_t min_width = has_hidden_rows || row_count == 0 ? minimum_row_length : 0;
	vector<idx_t> column_map;
	idx_t total_length;
	auto widths =
	    ComputeRenderWidths(column_names, result_types, collections, min_width, max_width, column_map, total_length);

	// render boundaries for the individual columns
	vector<idx_t> boundaries;
	for (idx_t c = 0; c < widths.size(); c++) {
		idx_t render_boundary;
		if (c == 0) {
			render_boundary = widths[c] + 2;
		} else {
			render_boundary = boundaries[c - 1] + widths[c] + 3;
		}
		boundaries.push_back(render_boundary);
	}

	// now begin rendering
	// first render the header
	RenderHeader(column_names, result_types, column_map, widths, boundaries, total_length, row_count > 0, ss);

	// render the values, if there are any
	RenderValues(collections, column_map, widths, result_types, ss);

	// render the row count and column count
	auto column_count_str = to_string(result.ColumnCount()) + " column";
	if (result.ColumnCount() > 1) {
		column_count_str += "s";
	}
	bool has_hidden_columns = false;
	for (auto entry : column_map) {
		if (entry == SPLIT_COLUMN) {
			has_hidden_columns = true;
			break;
		}
	}
	idx_t column_count = column_map.size();
	if (config.render_mode == RenderMode::COLUMNS) {
		if (has_hidden_columns) {
			has_hidden_rows = true;
			shown_str = " (" + to_string(column_count - 3) + " shown)";
		} else {
			shown_str = string();
		}
	} else {
		if (has_hidden_columns) {
			column_count--;
			column_count_str += " (" + to_string(column_count) + " shown)";
		}
	}

	RenderRowCount(std::move(row_count_str), std::move(shown_str), column_count_str, boundaries, has_hidden_rows,
	               has_hidden_columns, total_length, row_count, column_count, minimum_row_length, ss);
}